

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_time.c
# Opt level: O0

ASN1_TIME * ASN1_TIME_adj(ASN1_TIME *s,time_t t,int offset_day,long offset_sec)

{
  int iVar1;
  tm *ts_00;
  tm data;
  tm *ts;
  tm *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  tm *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffcc;
  ASN1_TIME *local_8;
  
  ts_00 = OPENSSL_gmtime((time_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa0);
  if (ts_00 == (tm *)0x0) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac,(char *)in_stack_ffffffffffffffa0);
    ERR_set_error(0xd,0xad,(char *)0x0);
    local_8 = (ASN1_TIME *)0x0;
  }
  else if (((offset_day == 0) && ((ASN1_TIME *)offset_sec == (ASN1_TIME *)0x0)) ||
          (iVar1 = OPENSSL_gmtime_adj(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
          , iVar1 != 0)) {
    local_8 = ossl_asn1_time_from_tm((ASN1_TIME *)offset_sec,ts_00,in_stack_ffffffffffffffcc);
  }
  else {
    local_8 = (ASN1_TIME *)0x0;
  }
  return (ASN1_TIME *)local_8;
}

Assistant:

ASN1_TIME *ASN1_TIME_adj(ASN1_TIME *s, time_t t,
                         int offset_day, long offset_sec)
{
    struct tm *ts;
    struct tm data;

    ts = OPENSSL_gmtime(&t, &data);
    if (ts == NULL) {
        ERR_raise(ERR_LIB_ASN1, ASN1_R_ERROR_GETTING_TIME);
        return NULL;
    }
    if (offset_day || offset_sec) {
        if (!OPENSSL_gmtime_adj(ts, offset_day, offset_sec))
            return NULL;
    }
    return ossl_asn1_time_from_tm(s, ts, V_ASN1_UNDEF);
}